

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

void __thiscall r_exec::Group::_update_saliency(Group *this,GroupState *state,View *view)

{
  atomic_int_fast64_t *paVar1;
  multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
  *pmVar2;
  Code *object;
  ushort uVar3;
  SyncMode SVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar8;
  _Alloc_node __an;
  key_type local_40;
  double local_38;
  double local_30;
  _Alloc_node local_28;
  
  fVar6 = r_exec::View::get_sln(view);
  local_30 = state->former_sln_thr;
  local_38 = update_sln(this,view);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,2);
  fVar7 = (float)r_code::Atom::asFloat();
  if (state->is_c_salient != true) {
    return;
  }
  if (((double)fVar7 < local_38) &&
     (SVar4 = r_exec::View::get_sync(view), SVar4 < (SYNC_ONCE_AXIOM|SYNC_PERIODIC))) {
    if ((0x13U >> (SVar4 & 0x1f) & 1) == 0) {
      uVar5 = (*Now)();
      uVar3 = r_code::Atom::asIndex();
      r_code::Utils::SetTimestamp
                ((Atom *)((long)(view->super_View).references + (ulong)uVar3 * 4 + 0x18),uVar5);
      pmVar2 = &this->newly_salient_views;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      local_40.object = (_Object *)view;
      pVar8 = std::
              _Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
              ::_M_get_insert_equal_pos(&pmVar2->_M_t,&local_40);
      local_28._M_t = &pmVar2->_M_t;
      std::
      _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
      ::
      _M_insert_<core::P<r_exec::View>,std::_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>::_Alloc_node>
                ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                  *)pmVar2,pVar8.first,pVar8.second,&local_40,&local_28);
    }
    else {
      if (local_30 < (double)fVar6) goto LAB_0016ee9a;
      pmVar2 = &this->newly_salient_views;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      local_40.object = (_Object *)view;
      pVar8 = std::
              _Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
              ::_M_get_insert_equal_pos(&pmVar2->_M_t,&local_40);
      local_28._M_t = &pmVar2->_M_t;
      std::
      _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
      ::
      _M_insert_<core::P<r_exec::View>,std::_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>::_Alloc_node>
                ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                  *)pmVar2,pVar8.first,pVar8.second,&local_40,&local_28);
    }
    if ((View *)local_40.object != (View *)0x0) {
      LOCK();
      ((local_40.object)->refCount).super___atomic_base<long>._M_i =
           ((local_40.object)->refCount).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if (((local_40.object)->refCount).super___atomic_base<long>._M_i < 1) {
        (*(((View *)&(local_40.object)->_vptr__Object)->super__Object)._vptr__Object[1])();
      }
    }
  }
LAB_0016ee9a:
  if (state->is_c_active == true) {
    object = (Code *)(view->super_View).object.object;
    local_38 = local_38 - (double)fVar6;
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,2);
    fVar6 = (float)r_code::Atom::asFloat();
    _initiate_sln_propagation(this,object,local_38,(double)fVar6);
  }
  return;
}

Assistant:

void Group::_update_saliency(GroupState *state, View *view)
{
    double view_old_sln = view->get_sln();
    bool wiew_was_salient = view_old_sln > state->former_sln_thr;
    double view_new_sln = update_sln(view);
    bool wiew_is_salient = view_new_sln > get_sln_thr();

    if (state->is_c_salient) {
        if (wiew_is_salient) {
            switch (view->get_sync()) {
            case View::SYNC_ONCE:
            case View::SYNC_ONCE_AXIOM:
            case View::SYNC_PERIODIC:
                if (!wiew_was_salient) { // sync on front: crosses the threshold upward: record as a newly salient view.
                    newly_salient_views.insert(view);
                }

                break;

            case View::SYNC_HOLD:
            case View::SYNC_AXIOM: // sync on state: treat as if it was a new injection.
                view->set_ijt(Now());
                newly_salient_views.insert(view);
                break;
            }
        }

        // inject sln propagation jobs.
        // the idea is to propagate sln changes when a view "occurs to the mind", i.e. becomes more salient in a group and is eligible for reduction in that group.
        // - when a view is now salient because the group becomes c-salient, no propagation;
        // - when a view is now salient because the group's sln_thr gets lower, no propagation;
        // - propagation can occur only if the group is c_active. For efficiency reasons, no propagation occurs even if some of the group's viewing groups are c-active and c-salient.
        if (state->is_c_active) {
            _initiate_sln_propagation(view->object, view_new_sln - view_old_sln, get_sln_thr());
        }
    }
}